

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O0

ostream * operator<<(ostream *out,LUPMatrix *lup_matrix)

{
  string local_68;
  string local_38;
  LUPMatrix *local_18;
  LUPMatrix *lup_matrix_local;
  ostream *out_local;
  
  local_18 = lup_matrix;
  lup_matrix_local = (LUPMatrix *)out;
  if (Options::output_type == 0) {
    LUPMatrix::ToString_abi_cxx11_(&local_38,lup_matrix);
    std::operator<<(out,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else if (Options::output_type == 1) {
    LUPMatrix::ToLaTex_abi_cxx11_(&local_68,lup_matrix);
    std::operator<<(out,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return (ostream *)lup_matrix_local;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const LUPMatrix& lup_matrix) {
  if (Options::output_type == Options::OutputType::Standard) {
    out << lup_matrix.ToString();
  } else if (Options::output_type == Options::OutputType::LaTex) {
    out << lup_matrix.ToLaTex();
  }

  return out;
}